

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::RuntimeImp::removeBreakPoint(RuntimeImp *this,BreakPointId breakPointId)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  undefined8 *puVar4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  _Node_iterator_base<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_false>
  __it;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lockDebugger);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->paused == false) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    puVar4[1] = puVar4 + 3;
    puVar4[2] = 0;
    *(undefined1 *)(puVar4 + 3) = 0;
    *puVar4 = &PTR__NativeException_00246940;
    __cxa_throw(puVar4,&debugger::IllegalRuntimeStateException::typeinfo,
                NativeException::~NativeException);
  }
  uVar1 = (this->breakPoints)._M_h._M_bucket_count;
  uVar5 = breakPointId % uVar1;
  p_Var6 = (this->breakPoints)._M_h._M_buckets[uVar5];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6,
     p_Var6->_M_nxt[1]._M_nxt != (_Hash_node_base *)breakPointId)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var7 = p_Var6, p_Var2[1]._M_nxt == (_Hash_node_base *)breakPointId)) goto LAB_00135383;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_00135383:
  if (p_Var7 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var7->_M_nxt;
  }
  if (__it._M_cur == (__node_type *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar4 = 0;
    puVar4[1] = 0;
    puVar4[2] = 0;
    puVar4[3] = 0;
    puVar4[4] = 0;
    puVar4[1] = puVar4 + 3;
    puVar4[2] = 0;
    *(undefined1 *)(puVar4 + 3) = 0;
    *puVar4 = &PTR__NativeException_00245b18;
    __cxa_throw(puVar4,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
  }
  cancelBreakPoint(this,(BreakPoint *)((long)__it._M_cur + 0x10));
  std::
  _Hashtable<chatra::debugger::BreakPointId,_std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>,_std::allocator<std::pair<const_chatra::debugger::BreakPointId,_chatra::BreakPoint>_>,_std::__detail::_Select1st,_std::equal_to<chatra::debugger::BreakPointId>,_std::hash<chatra::debugger::BreakPointId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->breakPoints)._M_h,(const_iterator)__it._M_cur);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lockDebugger);
  return;
}

Assistant:

void RuntimeImp::removeBreakPoint(debugger::BreakPointId breakPointId) {
	CHATRA_CHECK_RUNTIME_PAUSED;

	auto it = breakPoints.find(breakPointId);
	if (it == breakPoints.cend())
		throw IllegalArgumentException();

	cancelBreakPoint(it->second);
	breakPoints.erase(it);
}